

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O3

Descriptor *
despot::BuildUsage(string *lower_bounds_str,string *base_lower_bounds_str,string *upper_bounds_str,
                  string *base_upper_bounds_str)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
      ::lb_str_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                                 ::lb_str_abi_cxx11_);
    if (iVar1 != 0) {
      std::operator+(&local_48,"-l <arg>  \t--lbtype <arg>  \tLower bound strategy (",
                     lower_bounds_str);
      std::operator+(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                      ::lb_str_abi_cxx11_,&local_48,").");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::__cxx11::string::~string,
                   &BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                    ::lb_str_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                           ::lb_str_abi_cxx11_);
    }
  }
  if (BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
      ::blb_str_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                                 ::blb_str_abi_cxx11_);
    if (iVar1 != 0) {
      std::operator+(&local_48,"  \t--blbtype <arg>  \tBase lower bound (",base_lower_bounds_str);
      std::operator+(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                      ::blb_str_abi_cxx11_,&local_48,").");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::__cxx11::string::~string,
                   &BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                    ::blb_str_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                           ::blb_str_abi_cxx11_);
    }
  }
  if (BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
      ::ub_str_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                                 ::ub_str_abi_cxx11_);
    if (iVar1 != 0) {
      std::operator+(&local_48,"-u <arg>  \t--ubtype <arg>  \tUpper bound strategy (",
                     upper_bounds_str);
      std::operator+(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                      ::ub_str_abi_cxx11_,&local_48,").");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::__cxx11::string::~string,
                   &BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                    ::ub_str_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                           ::ub_str_abi_cxx11_);
    }
  }
  if (BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
      ::bub_str_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                                 ::bub_str_abi_cxx11_);
    if (iVar1 != 0) {
      std::operator+(&local_48,"  \t--bubtype <arg>  \tBase upper bound (",base_upper_bounds_str);
      std::operator+(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                      ::bub_str_abi_cxx11_,&local_48,").");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::__cxx11::string::~string,
                   &BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                    ::bub_str_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                           ::bub_str_abi_cxx11_);
    }
  }
  if (BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
      ::usage == '\0') {
    BuildUsage();
  }
  return BuildUsage::usage;
}

Assistant:

option::Descriptor* BuildUsage(string lower_bounds_str,
		string base_lower_bounds_str, string upper_bounds_str,
		string base_upper_bounds_str) {
	static string lb_str =
			"-l <arg>  \t--lbtype <arg>  \tLower bound strategy ("
					+ lower_bounds_str + ").";
	static string blb_str = "  \t--blbtype <arg>  \tBase lower bound ("
			+ base_lower_bounds_str + ").";
	static string ub_str =
			"-u <arg>  \t--ubtype <arg>  \tUpper bound strategy ("
					+ upper_bounds_str + ").";
	static string bub_str = "  \t--bubtype <arg>  \tBase upper bound ("
			+ base_upper_bounds_str + ").";
	// option::Arg::Required is a misnomer. The program won't complain if these
	// are absent, and required flags must be checked manually.
	static option::Descriptor usage[] =
			{ { E_HELP, 0, "", "help", option::Arg::None,
					"  \t--help\tPrint usage and exit." },
					{ E_PARAMS_FILE, 0, "m", "model-params",
							option::Arg::Required,
							"-m <arg>  \t--model-params <arg>  \tPath to model-parameters file, if "
									"any." },
					{ E_WORLD_FILE, 0, "w", "world-params",
							option::Arg::Required,
							"-w <arg>  \t--world-params <arg>  \tPath to world-parameters file, if "
									"any." },
					{ E_SIZE, 0, "", "size", option::Arg::Required,
							"  \t--size <arg>  \tSize of a problem (problem specific)." },
					{ E_NUMBER, 0, "", "number", option::Arg::Required,
							"  \t--number <arg>  \tNumber of elements of a problem (problem "
									"specific)." },
					{ E_DEPTH, 0, "d", "depth", option::Arg::Required,
							"-d <arg>  \t--depth <arg>  \tMaximum depth of search tree (default 90)." },
					{ E_DISCOUNT, 0, "g", "discount", option::Arg::Required,
							"-g <arg>  \t--discount <arg>  \tDiscount factor (default 0.95)." },
					{ E_TIMEOUT, 0, "t", "timeout", option::Arg::Required,
							"-t <arg>  \t--timeout <arg>  \tSearch time per move, in seconds (default "
									"1)." },
					{ E_NUMPARTICLES, 0, "n", "nparticles",
							option::Arg::Required,
							"-n <arg>  \t--nparticles <arg>  \tNumber of particles (default 500)." },
					{ E_PRUNE, 0, "p", "prune", option::Arg::Required,
							"-p <arg>  \t--prune <arg>  \tPruning constant (default no pruning)." },
					{ E_GAP, 0, "", "xi", option::Arg::Required,
							"  \t--xi <arg>  \tGap constant (default to 0.95)." },
					{ E_MAX_POLICY_SIM_LEN, 0, "", "max-policy-simlen",
							option::Arg::Required,
							"  \t--max-policy-simlen <arg>  \tDepth to simulate the default policy "
									"until. (default 90)." },

					{ E_SEED, 0, "r", "seed", option::Arg::Required,
							"-r <arg>  \t--seed <arg>  \tRandom number seed (default is random)." },
					{ E_SIM_LEN, 0, "s", "simlen", option::Arg::Required,
							"-s <arg>  \t--simlen <arg>  \tNumber of steps to simulate. (default 90; 0 "
									"= infinite)." },
					{ E_RUNS, 0, "", "runs", option::Arg::Required,
							"  \t--runs <arg>  \tNumber of runs. (default 1)." },
					{ E_LBTYPE, 0, "l", "lbtype", option::Arg::Required,
							lb_str.c_str() }, { E_BLBTYPE, 0, "", "blbtype",
							option::Arg::Required, blb_str.c_str() }, {
							E_UBTYPE, 0, "u", "ubtype", option::Arg::Required,
							ub_str.c_str() }, { E_BUBTYPE, 0, "", "bubtype",
							option::Arg::Required, bub_str.c_str() },
					{ E_BELIEF, 0, "b", "belief", option::Arg::Required,
							"-b <arg>  \t--belief <arg>  \tBelief update strategy, if applicable." },
					{ E_NOISE, 0, "", "noise", option::Arg::Required,
							"  \t--noise <arg>  \tNoise level for transition in POMDPX belief "
									"update." },

					{ E_VERBOSITY, 0, "v", "verbosity", option::Arg::Required,
							"-v <arg>  \t--verbosity <arg>  \tVerbosity level." },
					{ E_SILENCE, 0, "", "silence", option::Arg::None,
							"  \t--silence  \tReduce default output to minimal." },
					{ E_SOLVER, 0, "", "solver", option::Arg::Required,
							"  \t--solver <arg>  \t" }, { E_PRIOR, 0, "",
							"prior", option::Arg::Required,
							"  \t--prior <arg>  \tPOMCP prior." }, { 0, 0, 0, 0,
							0, 0 } };
	return usage;
}